

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

optional_idx duckdb::Prefix::GetMismatchWithKey(ART *art,Node *node,ARTKey *key,idx_t *depth)

{
  byte bVar1;
  data_ptr_t pdVar2;
  idx_t i;
  ulong index;
  optional_idx local_48;
  Prefix prefix;
  
  index = 0;
  Prefix(&prefix,art,(Node)(node->super_IndexPointer).data,false,false);
  bVar1 = art->prefix_count;
  pdVar2 = key->data;
  while( true ) {
    if (prefix.data[bVar1] <= index) {
      return (optional_idx)0xffffffffffffffff;
    }
    if (prefix.data[index] != pdVar2[*depth]) break;
    *depth = *depth + 1;
    index = index + 1;
  }
  optional_idx::optional_idx(&local_48,index);
  return (optional_idx)local_48.index;
}

Assistant:

optional_idx Prefix::GetMismatchWithKey(ART &art, const Node &node, const ARTKey &key, idx_t &depth) {
	Prefix prefix(art, node);
	for (idx_t i = 0; i < prefix.data[Prefix::Count(art)]; i++) {
		if (prefix.data[i] != key[depth]) {
			return i;
		}
		depth++;
	}
	return optional_idx::Invalid();
}